

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_boost_po.h
# Opt level: O2

void __thiscall
VW::config::options_boost_po::add_to_description<std::vector<char,std::allocator<char>>>
          (options_boost_po *this,
          shared_ptr<VW::config::typed_option<std::vector<char,_std::allocator<char>_>_>_> *opt,
          options_description *options_description)

{
  value_semantic *pvVar1;
  bool bVar2;
  typed_value<std::vector<char,_std::allocator<char>_>,_char> *ptVar3;
  size_type sVar4;
  string boost_option_name;
  undefined8 local_40;
  value_semantic *local_38 [4];
  
  std::__cxx11::string::string
            ((string *)local_38,
             (string *)
             &(((opt->
                super___shared_ptr<VW::config::typed_option<std::vector<char,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                )._M_ptr)->super_base_option).m_name);
  bVar2 = std::operator!=(&(((opt->
                             super___shared_ptr<VW::config::typed_option<std::vector<char,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                             )._M_ptr)->super_base_option).m_short_name,"");
  if (bVar2) {
    std::__cxx11::string::append((char *)local_38);
    std::__cxx11::string::append((string *)local_38);
  }
  local_40 = boost::program_options::options_description::add_options();
  pvVar1 = local_38[0];
  ptVar3 = convert_to_boost_value<char>(this,opt);
  boost::program_options::options_description_easy_init::operator()
            ((char *)&local_40,pvVar1,(char *)ptVar3);
  sVar4 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count(&this->m_defined_options,
                  &(((opt->
                     super___shared_ptr<VW::config::typed_option<std::vector<char,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr)->super_base_option).m_name);
  if (sVar4 == 0) {
    local_40 = boost::program_options::options_description::add_options();
    ptVar3 = convert_to_boost_value<char>(this,opt);
    boost::program_options::options_description_easy_init::operator()
              ((char *)&local_40,local_38[0],(char *)ptVar3);
  }
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void options_boost_po::add_to_description(
    std::shared_ptr<typed_option<T>> opt, po::options_description& options_description)
{
  std::string boost_option_name = opt->m_name;
  if (opt->m_short_name != "")
  {
    boost_option_name += ",";
    boost_option_name += opt->m_short_name;
  }
  options_description.add_options()(boost_option_name.c_str(), convert_to_boost_value(opt), opt->m_help.c_str());

  if (m_defined_options.count(opt->m_name) == 0)
  {
    // TODO may need to add noop notifier here.
    master_description.add_options()(boost_option_name.c_str(), convert_to_boost_value(opt), "");
  }
}